

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

optional<long> __thiscall wallet::CWallet::GetOldestKeyPoolTime(CWallet *this)

{
  bool bVar1;
  pointer pSVar2;
  _Storage<long,_true> *p_Var3;
  undefined8 extraout_RDX;
  char *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar4;
  pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>
  *spk_man_pair;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock56;
  optional<long> oldest_key;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  optional<long> *in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff6b;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff80;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff88;
  _Storage<long,_true> local_18;
  _Storage<long,_true> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,(bool)in_stack_ffffffffffffff6b);
  bVar1 = std::
          map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
          ::empty(in_stack_ffffffffffffff48);
  if (bVar1) {
    std::optional<long>::optional((optional<long> *)&local_18);
  }
  else {
    std::numeric_limits<long>::max();
    std::optional<long>::optional<long,_true>
              (in_stack_ffffffffffffff58,
               (long *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    std::
    map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
    ::begin((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    std::
    map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
    ::end((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    while (bVar1 = std::operator==((_Self *)in_stack_ffffffffffffff58,
                                   (_Self *)CONCAT17(in_stack_ffffffffffffff57,
                                                     in_stack_ffffffffffffff50)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                   *)in_stack_ffffffffffffff48);
      pSVar2 = std::
               unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
               operator->((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                           *)in_stack_ffffffffffffff48);
      (*pSVar2->_vptr_ScriptPubKeyMan[0x11])();
      p_Var3 = (_Storage<long,_true> *)
               std::min<std::optional<long>>
                         (in_stack_ffffffffffffff58,
                          (optional<long> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      local_18 = *p_Var3;
      local_10 = p_Var3[1];
      std::
      _Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                    *)in_stack_ffffffffffffff48);
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)extraout_RDX >> 8);
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = (bool)local_10._0_1_;
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = local_18._M_value;
  return (optional<long>)
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> CWallet::GetOldestKeyPoolTime() const
{
    LOCK(cs_wallet);
    if (m_spk_managers.empty()) {
        return std::nullopt;
    }

    std::optional<int64_t> oldest_key{std::numeric_limits<int64_t>::max()};
    for (const auto& spk_man_pair : m_spk_managers) {
        oldest_key = std::min(oldest_key, spk_man_pair.second->GetOldestKeyPoolTime());
    }
    return oldest_key;
}